

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O3

bool __thiscall CNetAddr::IsValid(CNetAddr *this)

{
  Network NVar1;
  uint uVar2;
  long lVar3;
  bool bVar4;
  CNetAddr *pCVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  uchar ipNone6 [16];
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  NVar1 = this->m_net;
  if (NVar1 == NET_CJDNS) {
    pCVar5 = this;
    if (0x10 < (this->m_addr)._size) {
      pCVar5 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    }
    if ((pCVar5->m_addr)._union.direct[0] == -4) goto LAB_006c002c;
  }
  else {
    if (NVar1 == NET_IPV6) {
      pCVar5 = this;
      if (0x10 < (this->m_addr)._size) {
        pCVar5 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
      }
      auVar6[0] = -((pCVar5->m_addr)._union.direct[0] == '\0');
      auVar6[1] = -((pCVar5->m_addr)._union.direct[1] == '\0');
      auVar6[2] = -((pCVar5->m_addr)._union.direct[2] == '\0');
      auVar6[3] = -((pCVar5->m_addr)._union.direct[3] == '\0');
      auVar6[4] = -((pCVar5->m_addr)._union.direct[4] == '\0');
      auVar6[5] = -((pCVar5->m_addr)._union.direct[5] == '\0');
      auVar6[6] = -((pCVar5->m_addr)._union.direct[6] == '\0');
      auVar6[7] = -((pCVar5->m_addr)._union.direct[7] == '\0');
      auVar6[8] = -((pCVar5->m_addr)._union.direct[8] == '\0');
      auVar6[9] = -((pCVar5->m_addr)._union.direct[9] == '\0');
      auVar6[10] = -((pCVar5->m_addr)._union.direct[10] == '\0');
      auVar6[0xb] = -((pCVar5->m_addr)._union.direct[0xb] == '\0');
      auVar6[0xc] = -((pCVar5->m_addr)._union.direct[0xc] == '\0');
      auVar6[0xd] = -((pCVar5->m_addr)._union.direct[0xd] == '\0');
      auVar6[0xe] = -((pCVar5->m_addr)._union.direct[0xe] == '\0');
      auVar6[0xf] = -((pCVar5->m_addr)._union.direct[0xf] == '\0');
      if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe | (ushort)(auVar6[0xf] >> 7) << 0xf
                  ) == 0xffff) goto LAB_006c003e;
    }
LAB_006c002c:
    bVar4 = IsRFC3849(this);
    if (NVar1 != NET_INTERNAL && !bVar4) {
      if (NVar1 == NET_IPV4) {
        if (0x10 < (this->m_addr)._size) {
          this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
        }
        uVar2 = *(uint *)&(this->m_addr)._union;
        if (0xfffffffd <
            (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) - 1)
        goto LAB_006c003e;
      }
      bVar4 = true;
      goto LAB_006c005d;
    }
  }
LAB_006c003e:
  bVar4 = false;
LAB_006c005d:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool CNetAddr::IsValid() const
{
    // unspecified IPv6 address (::/128)
    unsigned char ipNone6[16] = {};
    if (IsIPv6() && memcmp(m_addr.data(), ipNone6, sizeof(ipNone6)) == 0) {
        return false;
    }

    if (IsCJDNS() && !HasCJDNSPrefix()) {
        return false;
    }

    // documentation IPv6 address
    if (IsRFC3849())
        return false;

    if (IsInternal())
        return false;

    if (IsIPv4()) {
        const uint32_t addr = ReadBE32(m_addr.data());
        if (addr == INADDR_ANY || addr == INADDR_NONE) {
            return false;
        }
    }

    return true;
}